

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

void __thiscall
vkt::image::anon_unknown_0::BufferStoreTestInstance::commandBindDescriptorsForLayer
          (BufferStoreTestInstance *this,VkCommandBuffer cmdBuffer,VkPipelineLayout pipelineLayout,
          int layerNdx)

{
  DeviceInterface *pDVar1;
  VkCommandBuffer pVVar2;
  BufferStoreTestInstance *pBVar3;
  Handle<(vk::HandleType)22> *pHVar4;
  Handle<(vk::HandleType)12> *pTexelBufferView;
  DescriptorSetUpdateBuilder *this_00;
  Location local_90;
  VkDescriptorSet local_88;
  DescriptorSetUpdateBuilder local_80;
  DeviceInterface *local_38;
  DeviceInterface *vk;
  VkDevice device;
  VkCommandBuffer pVStack_20;
  int layerNdx_local;
  VkCommandBuffer cmdBuffer_local;
  BufferStoreTestInstance *this_local;
  VkPipelineLayout pipelineLayout_local;
  
  device._4_4_ = layerNdx;
  pVStack_20 = cmdBuffer;
  cmdBuffer_local = (VkCommandBuffer)this;
  this_local = (BufferStoreTestInstance *)pipelineLayout.m_internal;
  vk = (DeviceInterface *)
       Context::getDevice((this->super_StoreTestInstance).super_BaseTestInstance.super_TestInstance.
                          m_context);
  local_38 = Context::getDeviceInterface
                       ((this->super_StoreTestInstance).super_BaseTestInstance.super_TestInstance.
                        m_context);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_80);
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                     (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  local_88.m_internal = pHVar4->m_internal;
  local_90 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  pTexelBufferView =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)12>_>::get
                 (&(this->m_bufferView).super_RefBase<vk::Handle<(vk::HandleType)12>_>);
  this_00 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (&local_80,local_88,&local_90,VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,
                       pTexelBufferView);
  ::vk::DescriptorSetUpdateBuilder::update(this_00,local_38,(VkDevice)vk);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_80);
  pBVar3 = this_local;
  pVVar2 = pVStack_20;
  pDVar1 = local_38;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                     (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  (*pDVar1->_vptr_DeviceInterface[0x56])(pDVar1,pVVar2,1,pBVar3,0,1,pHVar4,0,0);
  return;
}

Assistant:

void BufferStoreTestInstance::commandBindDescriptorsForLayer (const VkCommandBuffer cmdBuffer, const VkPipelineLayout pipelineLayout, const int layerNdx)
{
	DE_ASSERT(layerNdx == 0);
	DE_UNREF(layerNdx);

	const VkDevice			device	= m_context.getDevice();
	const DeviceInterface&	vk		= m_context.getDeviceInterface();

	DescriptorSetUpdateBuilder()
		.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER, &m_bufferView.get())
		.update(vk, device);
	vk.cmdBindDescriptorSets(cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, pipelineLayout, 0u, 1u, &m_descriptorSet.get(), 0u, DE_NULL);
}